

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetFindSources_rec(Wln_Ret_t *p,int iObj)

{
  Vec_Int_t *p_00;
  int i;
  Wln_Ntk_t *pWVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  
  iVar2 = Wln_ObjIsCi(p->pNtk,iObj);
  if (iVar2 == 0) {
    pWVar1 = p->pNtk;
    p_00 = &pWVar1->vTravIds;
    iVar3 = Vec_IntEntry(p_00,iObj);
    iVar2 = pWVar1->nTravIds;
    if (iVar3 != iVar2) {
      Vec_IntWriteEntry(p_00,iObj,iVar2);
      iVar2 = Vec_IntEntry(&p->vPathDelays,iObj);
      iVar3 = Vec_IntEntry(&p->vNodeDelays,iObj);
      for (lVar6 = 0; lVar6 < p->pNtk->vFanins[iObj].nSize; lVar6 = lVar6 + 1) {
        piVar5 = Wln_RetFanins(p,iObj);
        i = piVar5[lVar6 * 2];
        piVar5 = Wln_RetFanins(p,iObj);
        if ((long)i != 0) {
          if (p->pNtk->vFanins[i].nSize == 0) {
            iVar4 = Wln_ObjIsCi(p->pNtk,i);
            if (iVar4 == 0) goto LAB_00321517;
          }
          if (piVar5[lVar6 * 2 + 1] == 0) {
            iVar4 = Vec_IntEntry(&p->vPathDelays,i);
            if (iVar4 == iVar2 - iVar3) {
              Wln_RetFindSources_rec(p,i);
            }
          }
        }
LAB_00321517:
      }
      if (iVar2 == iVar3) {
        Vec_IntPush(&p->vSources,iObj);
        return;
      }
    }
  }
  return;
}

Assistant:

void Wln_RetFindSources_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, FaninDelay;
    if ( Wln_ObjIsCi(p->pNtk, iObj) || Wln_ObjCheckTravId(p->pNtk, iObj) )
        return;
    FaninDelay = Vec_IntEntry( &p->vPathDelays, iObj ) - Vec_IntEntry( &p->vNodeDelays, iObj );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
        if ( !pLink[0] && Vec_IntEntry(&p->vPathDelays, iFanin) == FaninDelay )
            Wln_RetFindSources_rec( p, iFanin );
    if ( FaninDelay == 0 )
        Vec_IntPush( &p->vSources, iObj );
}